

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_debug_seq_parameter_set_svc_extension(sps_subset_t *sps_subset,bs_t *b)

{
  sps_svc_ext_t *psVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint32_t r_1;
  ulong uVar8;
  uint uVar9;
  FILE *pFVar10;
  int iVar11;
  uint32_t r;
  uint32_t r_2;
  bool bVar12;
  
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  psVar1 = (sps_subset->field_1).sps_svc_ext;
  uVar8 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    uVar8 = (ulong)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  psVar1->inter_layer_deblocking_filter_control_present_flag = SUB81(uVar8,0);
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar4 = 0;
  fprintf(pFVar10,"sps_svc_ext->inter_layer_deblocking_filter_control_present_flag: %d \n",uVar8);
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar3 = b->p;
  uVar9 = b->bits_left;
  iVar5 = 1;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar7 = 0;
    if (pbVar3 < b->end) {
      uVar7 = (uint)((*pbVar3 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar4 = uVar4 | uVar7 << ((byte)iVar5 & 0x1f);
    bVar12 = iVar5 != 0;
    iVar5 = iVar5 + -1;
  } while (bVar12);
  psVar1->extended_spatial_scalability_idc = (uchar)uVar4;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps_svc_ext->extended_spatial_scalability_idc: %d \n",(ulong)(uVar4 & 0xff));
  if (sps_subset->sps->chroma_format_idc - 1U < 2) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar8 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      uVar8 = (ulong)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar3 + 1;
      b->bits_left = 8;
    }
    psVar1->chroma_phase_x_plus1_flag = SUB81(uVar8,0);
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps_svc_ext->chroma_phase_x_plus1_flag: %d \n",uVar8);
    if (sps_subset->sps->chroma_format_idc == 1) {
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      uVar9 = 0;
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar3 = b->p;
      uVar4 = b->bits_left;
      iVar5 = 1;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar7 = 0;
        if (pbVar3 < b->end) {
          uVar7 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar9 = uVar9 | uVar7 << ((byte)iVar5 & 0x1f);
        bVar12 = iVar5 != 0;
        iVar5 = iVar5 + -1;
      } while (bVar12);
      psVar1->chroma_phase_y_plus1 = (uchar)uVar9;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"sps_svc_ext->chroma_phase_y_plus1: %d \n",(ulong)(uVar9 & 0xff));
    }
  }
  if (psVar1->extended_spatial_scalability_idc != '\0') {
    if (0 < sps_subset->sps->chroma_format_idc) {
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      uVar8 = 0;
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = b->bits_left - 1;
      b->bits_left = uVar4;
      pbVar3 = b->p;
      if (pbVar3 < b->end) {
        uVar8 = (ulong)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        b->p = pbVar3 + 1;
        b->bits_left = 8;
      }
      psVar1->seq_ref_layer_chroma_phase_x_plus1_flag = SUB81(uVar8,0);
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      uVar4 = 0;
      fprintf(pFVar10,"sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag: %d \n",uVar8);
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar3 = b->p;
      uVar9 = b->bits_left;
      iVar5 = 1;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar7 = 0;
        if (pbVar3 < b->end) {
          uVar7 = (uint)((*pbVar3 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar4 = uVar4 | uVar7 << ((byte)iVar5 & 0x1f);
        bVar12 = iVar5 != 0;
        iVar5 = iVar5 + -1;
      } while (bVar12);
      psVar1->seq_ref_layer_chroma_phase_y_plus1 = (uchar)uVar4;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1: %d \n",(ulong)(uVar4 & 0xff)
             );
    }
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    iVar5 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar3 = b->p;
    pbVar2 = b->end;
    uVar4 = b->bits_left;
    uVar9 = 0xffffffff;
    do {
      uVar4 = uVar4 - 1;
      b->bits_left = uVar4;
      bVar12 = true;
      if (pbVar3 < pbVar2) {
        bVar12 = (*pbVar3 >> (uVar4 & 0x1f) & 1) == 0;
      }
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar4 = 8;
      }
      uVar9 = uVar9 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar12 & uVar9 < 0x20)) && (pbVar3 < pbVar2));
    if (iVar5 == -1) {
      uVar9 = 0;
    }
    else {
      iVar6 = -2 - iVar5;
      iVar11 = -3 - iVar5;
      uVar9 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar7 = 0;
        if (pbVar3 < pbVar2) {
          uVar7 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar9 = uVar9 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    uVar7 = -1 << (~(byte)iVar5 & 0x1f);
    uVar4 = ~uVar7 + uVar9;
    iVar5 = -((int)uVar4 >> 1);
    if ((uVar4 & 1) != 0) {
      iVar5 = (int)(uVar9 - uVar7) >> 1;
    }
    uVar4 = 0xffffffff;
    psVar1->seq_scaled_ref_layer_left_offset = iVar5;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    iVar5 = 0;
    fprintf(pFVar10,"sps_svc_ext->seq_scaled_ref_layer_left_offset: %d \n");
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar3 = b->p;
    pbVar2 = b->end;
    uVar9 = b->bits_left;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar3 < pbVar2) {
        bVar12 = (*pbVar3 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar12 & uVar4 < 0x20)) && (pbVar3 < pbVar2));
    if (iVar5 == -1) {
      uVar4 = 0;
    }
    else {
      iVar6 = -2 - iVar5;
      iVar11 = -3 - iVar5;
      uVar4 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar7 = 0;
        if (pbVar3 < pbVar2) {
          uVar7 = (uint)((*pbVar3 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar4 = uVar4 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    uVar7 = -1 << (~(byte)iVar5 & 0x1f);
    uVar9 = ~uVar7 + uVar4;
    iVar5 = -((int)uVar9 >> 1);
    if ((uVar9 & 1) != 0) {
      iVar5 = (int)(uVar4 - uVar7) >> 1;
    }
    uVar4 = 0xffffffff;
    psVar1->seq_scaled_ref_layer_top_offset = iVar5;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    iVar5 = 0;
    fprintf(pFVar10,"sps_svc_ext->seq_scaled_ref_layer_top_offset: %d \n");
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar3 = b->p;
    pbVar2 = b->end;
    uVar9 = b->bits_left;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar3 < pbVar2) {
        bVar12 = (*pbVar3 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar12 & uVar4 < 0x20)) && (pbVar3 < pbVar2));
    if (iVar5 == -1) {
      uVar4 = 0;
    }
    else {
      iVar6 = -2 - iVar5;
      iVar11 = -3 - iVar5;
      uVar4 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar7 = 0;
        if (pbVar3 < pbVar2) {
          uVar7 = (uint)((*pbVar3 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar4 = uVar4 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    uVar7 = -1 << (~(byte)iVar5 & 0x1f);
    uVar9 = ~uVar7 + uVar4;
    iVar5 = -((int)uVar9 >> 1);
    if ((uVar9 & 1) != 0) {
      iVar5 = (int)(uVar4 - uVar7) >> 1;
    }
    uVar4 = 0xffffffff;
    psVar1->seq_scaled_ref_layer_right_offset = iVar5;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    iVar5 = 0;
    fprintf(pFVar10,"sps_svc_ext->seq_scaled_ref_layer_right_offset: %d \n");
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar3 = b->p;
    pbVar2 = b->end;
    uVar9 = b->bits_left;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar3 < pbVar2) {
        bVar12 = (*pbVar3 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar12 & uVar4 < 0x20)) && (pbVar3 < pbVar2));
    if (iVar5 == -1) {
      uVar4 = 0;
    }
    else {
      iVar6 = -2 - iVar5;
      iVar11 = -3 - iVar5;
      uVar4 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar7 = 0;
        if (pbVar3 < pbVar2) {
          uVar7 = (uint)((*pbVar3 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar4 = uVar4 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    uVar7 = -1 << (~(byte)iVar5 & 0x1f);
    uVar9 = ~uVar7 + uVar4;
    iVar5 = -((int)uVar9 >> 1);
    if ((uVar9 & 1) != 0) {
      iVar5 = (int)(uVar4 - uVar7) >> 1;
    }
    psVar1->seq_scaled_ref_layer_bottom_offset = iVar5;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps_svc_ext->seq_scaled_ref_layer_bottom_offset: %d \n");
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar8 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    uVar8 = (ulong)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  psVar1->seq_tcoeff_level_prediction_flag = SUB81(uVar8,0);
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps_svc_ext->seq_tcoeff_level_prediction_flag: %d \n",uVar8);
  if (psVar1->seq_tcoeff_level_prediction_flag == true) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar8 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      uVar8 = (ulong)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar3 + 1;
      b->bits_left = 8;
    }
    psVar1->adaptive_tcoeff_level_prediction_flag = SUB81(uVar8,0);
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps_svc_ext->adaptive_tcoeff_level_prediction_flag: %d \n",uVar8);
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar9 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    uVar9 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  psVar1->slice_header_restriction_flag = SUB41(uVar9,0);
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps_svc_ext->slice_header_restriction_flag: %d \n",(ulong)uVar9);
  return;
}

Assistant:

void read_debug_seq_parameter_set_svc_extension(sps_subset_t* sps_subset, bs_t* b)
{
    sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->inter_layer_deblocking_filter_control_present_flag = bs_read_u1(b); printf("sps_svc_ext->inter_layer_deblocking_filter_control_present_flag: %d \n", sps_svc_ext->inter_layer_deblocking_filter_control_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->extended_spatial_scalability_idc = bs_read_u(b, 2); printf("sps_svc_ext->extended_spatial_scalability_idc: %d \n", sps_svc_ext->extended_spatial_scalability_idc); 
    if( sps_subset->sps->chroma_format_idc == 1 || sps_subset->sps->chroma_format_idc == 2 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->chroma_phase_x_plus1_flag = bs_read_u1(b); printf("sps_svc_ext->chroma_phase_x_plus1_flag: %d \n", sps_svc_ext->chroma_phase_x_plus1_flag); 
    }
    if( sps_subset->sps->chroma_format_idc == 1 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->chroma_phase_y_plus1 = bs_read_u(b, 2); printf("sps_svc_ext->chroma_phase_y_plus1: %d \n", sps_svc_ext->chroma_phase_y_plus1); 
    }
    if( sps_svc_ext->extended_spatial_scalability_idc )
    {
        if( sps_subset->sps->chroma_format_idc > 0 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag = bs_read_u1(b); printf("sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag: %d \n", sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1 = bs_read_u(b, 2); printf("sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1: %d \n", sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_left_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_left_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_left_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_top_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_top_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_top_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_right_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_right_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_right_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_bottom_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_bottom_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_bottom_offset); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_tcoeff_level_prediction_flag = bs_read_u1(b); printf("sps_svc_ext->seq_tcoeff_level_prediction_flag: %d \n", sps_svc_ext->seq_tcoeff_level_prediction_flag); 
    if( sps_svc_ext->seq_tcoeff_level_prediction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->adaptive_tcoeff_level_prediction_flag = bs_read_u1(b); printf("sps_svc_ext->adaptive_tcoeff_level_prediction_flag: %d \n", sps_svc_ext->adaptive_tcoeff_level_prediction_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->slice_header_restriction_flag = bs_read_u1(b); printf("sps_svc_ext->slice_header_restriction_flag: %d \n", sps_svc_ext->slice_header_restriction_flag); 
}